

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxDotCross::Emit(FxDotCross *this,VMFunctionBuilder *build)

{
  byte bVar1;
  byte bVar2;
  PType *pPVar3;
  uint uVar4;
  ExpEmit EVar5;
  undefined4 extraout_var_00;
  ExpEmit EVar6;
  int opcode;
  ExpEmit op2;
  ExpEmit op1;
  ExpEmit local_40;
  ExpEmit local_38;
  undefined4 extraout_var;
  
  pPVar3 = (this->super_FxExpression).ValueType;
  bVar1 = pPVar3->RegType;
  bVar2 = pPVar3->RegCount;
  uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,(uint)bVar2);
  EVar5._0_4_ = (*this->left->_vptr_FxExpression[9])(this->left,build);
  EVar5.Konst = (bool)(char)extraout_var;
  EVar5.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar5.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar5.Target = (bool)(char)((uint)extraout_var >> 0x18);
  local_38 = EVar5;
  local_40._0_4_ = (*this->right->_vptr_FxExpression[9])(this->right,build);
  local_40.Konst = (bool)(char)extraout_var_00;
  local_40.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
  local_40.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
  local_40.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
  opcode = 0xc4;
  if (this->Operator != 0x167) {
    opcode = 0xb8;
    if ((PStruct *)this->left->ValueType == TypeVector3) {
      opcode = 0xc3;
    }
  }
  VMFunctionBuilder::Emit(build,opcode,uVar4 & 0xffff,EVar5._0_4_ & 0xffff,local_40._0_4_ & 0xffff);
  ExpEmit::Free(&local_38,build);
  ExpEmit::Free(&local_40,build);
  EVar6._0_4_ = (uint)bVar1 << 0x10 | (uint)bVar2 << 0x18 | uVar4 & 0xffff;
  EVar6.Konst = false;
  EVar6.Fixed = false;
  EVar6.Final = false;
  EVar6.Target = false;
  return EVar6;
}

Assistant:

ExpEmit FxDotCross::Emit(VMFunctionBuilder *build)
{
	ExpEmit to(build, ValueType->GetRegType(), ValueType->GetRegCount());
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	int op = Operator == TK_Cross ? OP_CROSSV_RR : left->ValueType == TypeVector3 ? OP_DOTV3_RR : OP_DOTV2_RR;
	build->Emit(op, to.RegNum, op1.RegNum, op2.RegNum);
	op1.Free(build);
	op2.Free(build);
	return to;
}